

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_>::rehash
          (Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *this,size_t sizeHint)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined4 uVar4;
  bool bVar5;
  size_t sVar6;
  Node<unsigned_int,_QAccessibleInterface_*> *pNVar7;
  Node<unsigned_int,_QAccessibleInterface_*> *pNVar8;
  void *pvVar9;
  long lVar10;
  long in_RDI;
  long in_FS_OFFSET;
  R RVar11;
  Node<unsigned_int,_QAccessibleInterface_*> *newNode;
  Node<unsigned_int,_QAccessibleInterface_*> *n;
  size_t index;
  Span *span;
  size_t s;
  size_t oldNSpans;
  size_t oldBucketCount;
  Span *oldSpans;
  size_t newBucketCount;
  Bucket it;
  size_t in_stack_ffffffffffffff48;
  Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *in_stack_ffffffffffffff50;
  uint *in_stack_ffffffffffffff58;
  Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *in_stack_ffffffffffffff60;
  long lVar12;
  size_t in_stack_ffffffffffffff90;
  ulong i;
  ulong local_60;
  Span *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar6 = GrowthPolicy::bucketsForCapacity(in_stack_ffffffffffffff48);
  lVar2 = *(long *)(in_RDI + 0x20);
  uVar3 = *(ulong *)(in_RDI + 0x10);
  RVar11 = allocateSpans(in_stack_ffffffffffffff90);
  local_50 = RVar11.spans;
  *(Span **)(in_RDI + 0x20) = local_50;
  *(size_t *)(in_RDI + 0x10) = sVar6;
  for (local_60 = 0; local_60 < uVar3 >> 7; local_60 = local_60 + 1) {
    for (i = 0; i < 0x80; i = i + 1) {
      bVar5 = Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_>::hasNode
                        ((Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *)
                         (lVar2 + local_60 * 0x90),i);
      if (bVar5) {
        pNVar7 = Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_>::at
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        findBucket<unsigned_int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pNVar8 = Bucket::insert((Bucket *)0x96e437);
        uVar4 = *(undefined4 *)&pNVar7->field_0x4;
        pNVar8->key = pNVar7->key;
        *(undefined4 *)&pNVar8->field_0x4 = uVar4;
        pNVar8->value = pNVar7->value;
      }
    }
    Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_>::freeData
              (in_stack_ffffffffffffff50);
  }
  if (lVar2 != 0) {
    pvVar9 = (void *)(lVar2 + -8);
    lVar12 = *(long *)(lVar2 + -8);
    lVar10 = lVar2 + lVar12 * 0x90;
    while (lVar2 != lVar10) {
      lVar10 = lVar10 + -0x90;
      Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_>::~Span
                ((Span<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *)0x96e4de);
    }
    operator_delete__(pvVar9,lVar12 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }